

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
* __thiscall
HighsCliqueTable::computeMaximalCliques
          (vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
           *__return_storage_ptr__,HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *vars,
          double feastol)

{
  CliqueVar CVar1;
  pointer pCVar2;
  const_iterator __begin1;
  pointer pCVar3;
  CliqueVar *var_1;
  pointer pCVar4;
  HighsInt Plen;
  ulong uVar5;
  ulong uVar6;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1;
  vector<double,_std::allocator<double>_> sol;
  vector<double,_std::allocator<double>_> local_108;
  undefined1 local_e8 [8];
  pointer local_e0;
  iterator iStack_d8;
  CliqueVar *local_d0;
  pointer pCStack_c8;
  pointer local_c0;
  pointer pCStack_b8;
  pointer local_b0;
  pointer pCStack_a8;
  pointer local_a0;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  vStack_98;
  pointer local_80;
  pointer piStack_78;
  pointer local_70;
  double dStack_68;
  double local_60;
  double local_58;
  HighsInt local_50;
  HighsInt local_4c;
  HighsInt local_48;
  int64_t local_40;
  int64_t local_38;
  
  pCVar3 = (vars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (vars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 == pCVar2) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    uVar5 = 0;
    do {
      uVar6 = (ulong)((uint)*pCVar3 & 0x7fffffff);
      if (((uint)*pCVar3 & 0x7fffffff) < uVar5) {
        uVar6 = uVar5;
      }
      pCVar3 = pCVar3 + 1;
      uVar5 = uVar6;
    } while (pCVar3 != pCVar2);
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize(&local_108,uVar6 + 1);
    pCVar2 = (vars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pCVar3 = (vars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (pCVar4 = pCVar3; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[(uint)*pCVar4 & 0x7fffffff] = (double)((uint)*pCVar4 >> 0x1f);
    }
    local_e0 = (pointer)0x0;
    iStack_d8._M_current = (CliqueVar *)0x0;
    local_d0 = (CliqueVar *)0x0;
    pCStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    pCStack_b8 = (pointer)0x0;
    local_b0 = (pointer)0x0;
    pCStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = (pointer)0x0;
    piStack_78 = (pointer)0x0;
    local_70 = (pointer)0x0;
    dStack_68 = 0.0;
    local_60 = 1.05;
    local_50 = 0;
    local_4c = 10000;
    local_48 = 100;
    local_40 = 0x7fffffffffffffff;
    local_38 = 0;
    local_e8 = (undefined1  [8])&local_108;
    local_58 = feastol;
    if (pCVar3 == pCVar2) {
      Plen = 0;
    }
    else {
      do {
        CVar1 = *pCVar3;
        if ((((this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff] == 0) &&
            ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff] == '\0')) &&
           ((this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0))] != 0))
        {
          if (iStack_d8._M_current == local_d0) {
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                      ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        *)&local_e0,iStack_d8,pCVar3);
          }
          else {
            *iStack_d8._M_current = CVar1;
            iStack_d8._M_current = iStack_d8._M_current + 1;
          }
        }
        pCVar3 = pCVar3 + 1;
      } while (pCVar3 != pCVar2);
      Plen = (HighsInt)((ulong)((long)iStack_d8._M_current - (long)local_e0) >> 2);
    }
    bronKerboschRecurse(this,(BronKerboschData *)local_e8,Plen,(CliqueVar *)0x0,0);
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         vStack_98.
         super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         vStack_98.
         super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_98.
         super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_98.
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_80 != (pointer)0x0) {
      operator_delete(local_80);
    }
    std::
    vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    ::~vector(&vStack_98);
    if (local_b0 != (pointer)0x0) {
      operator_delete(local_b0);
    }
    if (pCStack_c8 != (pointer)0x0) {
      operator_delete(pCStack_c8);
    }
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0);
    }
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<HighsCliqueTable::CliqueVar>>
HighsCliqueTable::computeMaximalCliques(const std::vector<CliqueVar>& vars,
                                        double feastol) {
  // return if there are no variables
  if (vars.empty())
    return std::vector<std::vector<HighsCliqueTable::CliqueVar>>{};

  // find max column index in clique variables
  size_t maxcolindex = 0;
  for (const auto& var : vars)
    maxcolindex = std::max(static_cast<size_t>(var.col), maxcolindex);

  // set up data
  std::vector<double> sol;
  sol.resize(maxcolindex + 1);
  for (const auto& var : vars) sol[var.col] = var.val;
  BronKerboschData data(sol);
  data.feastol = feastol;

  for (const auto& var : vars) {
    if (colsubstituted[var.col] || colDeleted[var.col]) continue;
    if (numCliques(var) != 0) data.P.emplace_back(var);
  }

  bronKerboschRecurse(data, data.P.size(), nullptr, 0);

  return std::move(data.cliques);
}